

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
std::
_Tuple_impl<1ul,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::_Ios_Openmode>>
::
_Tuple_impl<testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::_Ios_Openmode>,void>
          (_Tuple_impl<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<std::_Ios_Openmode>_>
           *this,Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *__head,Matcher<std::_Ios_Openmode> *__tail)

{
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.vtable_ =
       (__tail->super_MatcherBase<std::_Ios_Openmode>).vtable_;
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.buffer_ =
       (__tail->super_MatcherBase<std::_Ios_Openmode>).buffer_;
  (__tail->super_MatcherBase<std::_Ios_Openmode>).vtable_ = (VTable *)0x0;
  (this->super__Tuple_impl<2UL,_testing::Matcher<std::_Ios_Openmode>_>).
  super__Head_base<2UL,_testing::Matcher<std::_Ios_Openmode>,_false>._M_head_impl.
  super_MatcherBase<std::_Ios_Openmode>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00259f38;
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .vtable_ = (__head->
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).vtable_;
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .buffer_ = (__head->
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).buffer_;
  (__head->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  )._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00259e98;
  return;
}

Assistant:

MatcherBase(MatcherBase&& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    other.vtable_ = nullptr;
  }